

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.cc
# Opt level: O2

bool __thiscall xemmai::t_tuple::f_equals(t_tuple *this,t_pvalue *a_other)

{
  char *pcVar1;
  bool bVar2;
  t_pvalue *a_value;
  ulong uVar3;
  t_value<xemmai::t_slot> local_40;
  
  bVar2 = t_type_of<xemmai::t_object>::t_cast<xemmai::t_tuple>::f_is((a_other->super_t_pointer).v_p)
  ;
  if (bVar2) {
    pcVar1 = ((a_other->super_t_pointer).v_p)->v_data;
    if ((t_tuple *)pcVar1 == this) {
      return true;
    }
    if (this->v_size == *(size_t *)pcVar1) {
      uVar3 = 0xffffffffffffffff;
      a_value = (t_pvalue *)(this + 1);
      do {
        uVar3 = uVar3 + 1;
        bVar2 = this->v_size <= uVar3;
        if (bVar2) {
          return bVar2;
        }
        t_value<xemmai::t_slot>::f_equals(&local_40,a_value);
        a_value = a_value + 1;
      } while ((__pointer_type)0x1 < (ulong)local_40.super_t_slot.v_p._M_b._M_p);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool t_tuple::f_equals(const t_pvalue& a_other) const
{
	if (!f_is<t_tuple>(a_other)) return false;
	auto& other = a_other->f_as<t_tuple>();
	if (this == &other) return true;
	if (v_size != other.v_size) return false;
	for (size_t i = 0; i < v_size; ++i) if (!f_as<bool>((*this)[i].f_equals(other[i]))) return false;
	return true;
}